

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O0

wstring * __thiscall
PDA::Transducer::Identifier::contextToString_abi_cxx11_
          (wstring *__return_storage_ptr__,Identifier *this,Context cnt)

{
  allocator<wchar_t> local_29;
  allocator<wchar_t> local_28;
  allocator<wchar_t> local_27;
  allocator<wchar_t> local_26;
  allocator<wchar_t> local_25 [16];
  allocator<wchar_t> local_15;
  undefined4 local_14;
  wstring *pwStack_10;
  Context cnt_local;
  
  local_14 = SUB84(this,0);
  pwStack_10 = __return_storage_ptr__;
  switch((ulong)this & 0xffffffff) {
  case 0:
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
              ((wstring *)__return_storage_ptr__,L"Default",&local_15);
    std::allocator<wchar_t>::~allocator(&local_15);
    break;
  case 1:
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
              ((wstring *)__return_storage_ptr__,L"Declaration",&local_28);
    std::allocator<wchar_t>::~allocator(&local_28);
    break;
  case 2:
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
              ((wstring *)__return_storage_ptr__,L"Link",&local_26);
    std::allocator<wchar_t>::~allocator(&local_26);
    break;
  case 3:
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
              ((wstring *)__return_storage_ptr__,L"Argument",local_25);
    std::allocator<wchar_t>::~allocator(local_25);
    break;
  case 4:
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
              ((wstring *)__return_storage_ptr__,L"Literal",&local_27);
    std::allocator<wchar_t>::~allocator(&local_27);
    break;
  default:
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
              ((wstring *)__return_storage_ptr__,L"Default",&local_29);
    std::allocator<wchar_t>::~allocator(&local_29);
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring Identifier::contextToString(const Identifier::Context cnt)
{
    switch(cnt)
    {
    case Context::Default:
        return L"Default";
    case Context::Argument:
        return L"Argument";
    case Context::Link:
        return L"Link";
    case Context::Literal:
        return L"Literal";
    case Context::Declaration:
        return L"Declaration";
    }
    return L"Default";
}